

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-inventory.c
# Opt level: O1

_Bool borg_item_worth_id(borg_item *item)

{
  _Bool _Var1;
  wchar_t wVar2;
  
  _Var1 = borg_item_note_needs_id((borg_item_conflict *)item);
  if (_Var1) {
    wVar2 = borg_wield_slot(item);
    _Var1 = L'\xffffffff' < wVar2;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool borg_item_worth_id(const borg_item *item)
{
    int        slot;

    if (!borg_item_note_needs_id(item))
        return false;

    /* Things that can't be wielded can't be ID'd (potions, scrolls etc) */
    slot = borg_wield_slot(item);
    if (slot < 0)
        return false;

    return true;
}